

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::convertGlslangToSpvType
          (TGlslangToSpvTraverser *this,TType *type,TLayoutPacking explicitLayout,
          TQualifier *qualifier,bool lastBufferBlockMember,bool forwardReferenceOnly)

{
  Builder *pBVar1;
  map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
  *this_00;
  set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_> *psVar2;
  __index_type _Var3;
  char cVar4;
  TSampler TVar5;
  TSpirvType *this_01;
  pointer pTVar6;
  TIntermTyped *node;
  TVector<glslang::TArraySize> *pTVar7;
  TType *pTVar8;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_02;
  bool bVar9;
  int iVar10;
  Id IVar11;
  Dim DVar12;
  ImageFormat format;
  int iVar13;
  Id IVar14;
  Id IVar15;
  Id IVar16;
  int iVar17;
  uint uVar18;
  mapped_type id;
  Decoration DVar19;
  BuiltIn num;
  int iVar20;
  uint uVar21;
  mapped_type *pmVar22;
  mapped_type *pmVar23;
  mapped_type *pmVar24;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *pmVar25;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined7 extraout_var;
  const_iterator cVar26;
  undefined4 extraout_var_05;
  TSampler *sampler;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  mapped_type_conflict *pmVar27;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  pointer pTVar28;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  ulong uVar29;
  _Rb_tree_header *p_Var30;
  long lVar31;
  long lVar32;
  TIntermediate *pTVar33;
  bool forwardReferenceOnly_00;
  _Rb_tree_header *p_Var34;
  _Base_ptr p_Var35;
  pointer pTVar36;
  uint32_t i;
  char *pcVar37;
  Op opcode;
  TQualifier *pTVar38;
  Id *pIVar39;
  _Base_ptr p_Var40;
  undefined8 *puVar41;
  TQualifier *pTVar42;
  pointer ppVar43;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__s;
  undefined7 in_register_00000081;
  ulong uVar44;
  undefined8 uVar45;
  _Rb_tree_header *p_Var46;
  long lVar47;
  _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var48;
  byte bVar49;
  int offset;
  _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1c8;
  TQualifier *local_1c0;
  int local_1b4;
  _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1b0;
  int local_1a8;
  uint local_1a4;
  _Rb_tree_header *local_1a0;
  TTypeList *local_198;
  bool local_190;
  undefined7 uStack_18f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvMembers;
  Id spvMember;
  undefined4 uStack_164;
  undefined1 auStack_160 [8];
  TType local_158;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_c0;
  _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_b8;
  TTypeList *glslangMembers;
  TTypeList *local_a8;
  undefined4 local_a0;
  int dummyStride;
  TQualifier memberQualifier;
  vector<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
  deferredForwardPointers;
  undefined4 extraout_var_06;
  
  bVar49 = 0;
  local_a0 = (undefined4)CONCAT71(in_register_00000081,lastBufferBlockMember);
  local_1c0 = qualifier;
  iVar10 = (*type->_vptr_TType[7])(type);
  switch(iVar10) {
  case 0:
    id = spv::Builder::makeVoidType(&this->builder);
    iVar10 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar10 != '\0') {
      __assert_fail("! type.isArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1356,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                   );
    }
    break;
  case 1:
    iVar10 = 0x20;
    goto LAB_003bb861;
  case 2:
    iVar10 = 0x40;
    goto LAB_003bb861;
  case 3:
    iVar10 = 0x10;
LAB_003bb861:
    id = spv::Builder::makeFloatType(&this->builder,iVar10);
    break;
  case 4:
    iVar10 = 8;
    goto LAB_003bb8af;
  case 5:
    iVar10 = 8;
    goto LAB_003bb849;
  case 6:
    iVar10 = 0x10;
    goto LAB_003bb8af;
  case 7:
    iVar10 = 0x10;
    goto LAB_003bb849;
  case 8:
    iVar10 = 0x20;
    goto LAB_003bb8af;
  case 9:
    goto LAB_003bb5d8;
  case 10:
    iVar10 = 0x40;
LAB_003bb8af:
    bVar9 = true;
LAB_003bb8b4:
    id = spv::Builder::makeIntegerType(&this->builder,iVar10,bVar9);
    break;
  case 0xb:
    iVar10 = 0x40;
    goto LAB_003bb849;
  case 0xc:
    if (explicitLayout == ElpNone) {
      id = spv::Builder::makeBoolType(&this->builder);
      break;
    }
    goto LAB_003bb5d8;
  case 0xd:
    spvMember = 0x15;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&spvMember);
LAB_003bb5d8:
    iVar10 = 0x20;
LAB_003bb849:
    bVar9 = false;
    goto LAB_003bb8b4;
  case 0xe:
    iVar10 = (*type->_vptr_TType[8])(type);
    sampler = (TSampler *)CONCAT44(extraout_var_06,iVar10);
    pBVar1 = &this->builder;
    if ((sampler->field_0x2 & 0x20) == 0) {
      IVar11 = getSampledType(this,sampler);
      local_1c8 = (_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)CONCAT44(local_1c8._4_4_,IVar11);
      DVar12 = TranslateDimensionality(sampler);
      local_1b0 = (_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)CONCAT44(local_1b0._4_4_,DVar12);
      TVar5 = *sampler;
      format = TranslateImageFormat(this,type);
      id = spv::Builder::makeImageType
                     (pBVar1,(mapped_type)local_1c8,(Dim)local_1b0,
                      (bool)((byte)((uint)TVar5 >> 0x11) & 1),(bool)(TVar5._2_1_ & 1),
                      (bool)((byte)((uint)TVar5 >> 0x12) & 1),(((uint)TVar5 >> 0x13 & 1) != 0) + 1,
                      format);
      if ((((uint)*sampler >> 0x14 & 1) != 0) &&
         ((((uint)*sampler & 0xff00) != 0x600 ||
          ((this->glslangIntermediate->spvVersion).spv < 0x10600)))) {
        id = spv::Builder::makeSampledImageType(pBVar1,id);
      }
    }
    else {
      id = spv::Builder::makeSamplerType(pBVar1);
    }
    break;
  case 0xf:
  case 0x10:
    iVar10 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar10 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    glslangMembers = (type->field_13).structure;
    id = 0;
    if (((local_1c0->field_0xb & 0x10) == 0) &&
       (((~*(uint *)&local_1c0->field_0x1c & 0xfff) == 0 ||
        (iVar10 = (*type->_vptr_TType[7])(type), id = 0, iVar10 != 0x10)))) {
      pmVar22 = std::__detail::
                _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)(this->structMap[explicitLayout] +
                                (*(ulong *)&local_1c0->field_0x8 >> 0x3d)),&glslangMembers);
      id = *pmVar22;
    }
    if (id != 0) break;
    iVar10 = (*type->_vptr_TType[7])(type);
    if (iVar10 == 0x10) {
      pmVar23 = std::__detail::
                _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->glslangTypeToIdMap,&glslangMembers);
      pmVar24 = std::__detail::
                _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->memberRemapper,pmVar23);
      std::vector<int,_std::allocator<int>_>::resize
                (pmVar24,(long)(glslangMembers->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ).
                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(glslangMembers->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ).
                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
    }
    local_198 = glslangMembers;
    spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar10 = 0;
    deferredForwardPointers.
    super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deferredForwardPointers.
    super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    deferredForwardPointers.
    super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar28 = (glslangMembers->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(glslangMembers->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar28) >> 5)) {
      local_1c8 = (_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->memberRemapper;
      local_1b0 = (_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->glslangTypeToIdMap;
      local_1a0 = &(this->forwardPointers)._M_t._M_impl.super__Rb_tree_header;
      local_c0 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&(this->builder).debugTypeLocs;
      uVar44 = 0;
      do {
        iVar13 = (*(pTVar28[uVar44].type)->_vptr_TType[3])();
        if ((char)iVar13 == '\0') {
          pTVar28 = pTVar28 + uVar44;
          iVar13 = (*type->_vptr_TType[7])(type);
          if (iVar13 == 0x10) {
            bVar9 = filterMember(this,pTVar28->type);
            if (bVar9) {
              iVar10 = iVar10 + 1;
              pmVar23 = std::__detail::
                        _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_1b0,&local_198);
              pmVar24 = std::__detail::
                        _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_1c8,pmVar23);
              (pmVar24->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar44] = -1;
              goto LAB_003bb11a;
            }
            pmVar23 = std::__detail::
                      _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_1b0,&local_198);
            pmVar24 = std::__detail::
                      _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_1c8,pmVar23);
            (pmVar24->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[uVar44] = (int)uVar44 - iVar10;
          }
          iVar13 = (*pTVar28->type->_vptr_TType[10])();
          pTVar38 = local_1c0;
          puVar41 = (undefined8 *)CONCAT44(extraout_var_00,iVar13);
          pTVar42 = &memberQualifier;
          for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
            pTVar42->semanticName = (char *)*puVar41;
            puVar41 = puVar41 + (ulong)bVar49 * -2 + 1;
            pTVar42 = (TQualifier *)((long)pTVar42 + (ulong)bVar49 * -0x10 + 8);
          }
          InheritQualifiers(&memberQualifier,local_1c0);
          p_Var46 = local_1a0;
          if (((~memberQualifier._28_4_ & 0xfff) == 0) &&
             (uVar29 = *(ulong *)&pTVar38->field_0x1c & 0xfff, uVar29 != 0xfff)) {
            memberQualifier._28_8_ = uVar29 | memberQualifier._28_8_ & 0xfffffffffffff000;
          }
          if ((*(uint *)&pTVar38->field_0x8 & 0x7f) == 6) {
            bVar9 = uVar44 == (int)((ulong)((long)(local_198->
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_198->
                                                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ).
                                                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) -
                              1;
          }
          else {
            bVar9 = false;
          }
          iVar13 = (*pTVar28->type->_vptr_TType[7])();
          if (iVar13 == 0x12) {
            iVar13 = (*pTVar28->type->_vptr_TType[0x15])();
            uVar29 = CONCAT44(extraout_var_01,iVar13);
            p_Var30 = p_Var46;
            for (p_Var40 = (this->forwardPointers)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent; (_Rb_tree_header *)p_Var40 != (_Rb_tree_header *)0x0;
                p_Var40 = (&p_Var40->_M_left)[*(ulong *)(p_Var40 + 1) < uVar29]) {
              if (*(ulong *)(p_Var40 + 1) >= uVar29) {
                p_Var30 = (_Rb_tree_header *)p_Var40;
              }
            }
            p_Var34 = p_Var46;
            if ((p_Var30 != p_Var46) && (p_Var34 = p_Var30, uVar29 < p_Var30->_M_node_count)) {
              p_Var34 = p_Var46;
            }
            if (p_Var34 == p_Var46) {
              _spvMember = (pointer)pTVar28->type;
              pTVar38 = &memberQualifier;
              puVar41 = (undefined8 *)auStack_160;
              for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
                *puVar41 = pTVar38->semanticName;
                pTVar38 = (TQualifier *)((long)pTVar38 + (ulong)bVar49 * -0x10 + 8);
                puVar41 = puVar41 + (ulong)bVar49 * -2 + 1;
              }
              if (deferredForwardPointers.
                  super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  deferredForwardPointers.
                  super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::pair<glslang::TType*,glslang::TQualifier>,std::allocator<std::pair<glslang::TType*,glslang::TQualifier>>>
                ::_M_realloc_insert<std::pair<glslang::TType*,glslang::TQualifier>>
                          ((vector<std::pair<glslang::TType*,glslang::TQualifier>,std::allocator<std::pair<glslang::TType*,glslang::TQualifier>>>
                            *)&deferredForwardPointers,
                           (iterator)
                           deferredForwardPointers.
                           super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (pair<glslang::TType_*,_glslang::TQualifier> *)&spvMember);
              }
              else {
                pIVar39 = &spvMember;
                ppVar43 = deferredForwardPointers.
                          super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (lVar31 = 0xb; lVar31 != 0; lVar31 = lVar31 + -1) {
                  ppVar43->first = *(TType **)pIVar39;
                  pIVar39 = pIVar39 + (ulong)bVar49 * -4 + 2;
                  ppVar43 = (pointer)((long)ppVar43 + (ulong)bVar49 * -0x10 + 8);
                }
                deferredForwardPointers.
                super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     deferredForwardPointers.
                     super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          pTVar8 = pTVar28->type;
          iVar13 = (*pTVar8->_vptr_TType[7])(pTVar8);
          IVar11 = convertGlslangToSpvType
                             (this,pTVar8,explicitLayout,&memberQualifier,bVar9,iVar13 == 0x12);
          spvMember = IVar11;
          if (spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&spvMembers,
                       (iterator)
                       spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&spvMember);
          }
          else {
            *spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = IVar11;
            spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (this->options->emitNonSemanticShaderDebugInfo == true) {
            iVar13 = (*pTVar28->type->_vptr_TType[6])();
            this_02 = local_c0;
            pcVar37 = *(char **)(CONCAT44(extraout_var_02,iVar13) + 8);
            pmVar25 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_c0,&spvMember);
            local_b8 = (_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)(pmVar25->name)._M_string_length;
            strlen(pcVar37);
            std::__cxx11::string::_M_replace((ulong)pmVar25,0,(char *)local_b8,(ulong)pcVar37);
            iVar13 = (pTVar28->loc).line;
            pmVar25 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](this_02,&spvMember);
            pmVar25->line = iVar13;
            iVar13 = (pTVar28->loc).column;
            pmVar25 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](this_02,&spvMember);
            pmVar25->column = iVar13;
          }
        }
        else {
          iVar10 = iVar10 + 1;
          iVar13 = (*type->_vptr_TType[7])(type);
          if (iVar13 == 0x10) {
            pmVar23 = std::__detail::
                      _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_1b0,&local_198);
            pmVar24 = std::__detail::
                      _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_1c8,pmVar23);
            (pmVar24->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[uVar44] = -1;
          }
        }
LAB_003bb11a:
        uVar44 = uVar44 + 1;
        pTVar28 = (local_198->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)uVar44 <
               (long)(int)((ulong)((long)(local_198->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar28)
                          >> 5));
    }
    pBVar1 = &this->builder;
    iVar10 = (*type->_vptr_TType[5])(type);
    IVar11 = spv::Builder::makeStructType
                       (pBVar1,&spvMembers,*(char **)(CONCAT44(extraout_var_03,iVar10) + 8),false);
    local_1c8 = (_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)CONCAT44(local_1c8._4_4_,IVar11);
    if (((local_1c0->field_0xb & 0x10) == 0) &&
       (((~*(uint *)&local_1c0->field_0x1c & 0xfff) == 0 ||
        (iVar10 = (*type->_vptr_TType[7])(type), iVar10 != 0x10)))) {
      pmVar22 = std::__detail::
                _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)(this->structMap[explicitLayout] +
                                (*(ulong *)&local_1c0->field_0x8 >> 0x3d)),&local_198);
      *pmVar22 = (mapped_type)local_1c8;
    }
    local_a8 = local_198;
    offset = -1;
    id = (mapped_type)local_1c8;
    if (((type->arraySizes == (TArraySizes *)0x0) ||
        (pTVar7 = (type->arraySizes->sizes).sizes, pTVar7 == (TVector<glslang::TArraySize> *)0x0))
       || (local_1a4 = (uint)CONCAT71((int7)((ulong)pTVar7 >> 8),1),
          (int)((ulong)((long)(pTVar7->
                              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ).
                              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar7->
                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ).
                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2)) {
      iVar10 = (*type->_vptr_TType[0x1d])(type);
      if ((char)iVar10 == '\0') {
        local_1a4 = 0;
      }
      else {
        iVar10 = (*type->_vptr_TType[0xb])(type);
        bVar9 = glslang::TQualifier::isArrayedIo
                          ((TQualifier *)CONCAT44(extraout_var_04,iVar10),
                           this->glslangIntermediate->language);
        local_1a4 = (uint)CONCAT71(extraout_var,bVar9) ^ 1;
      }
    }
    pTVar28 = (local_a8->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(local_a8->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar28) >> 5)) {
      local_b8 = (_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->memberRemapper;
      local_c0 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>,_std::allocator<std::pair<const_unsigned_int,_spv::Builder::DebugTypeLoc>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->glslangTypeToIdMap;
      local_158.spirvType = (TSpirvType *)&(this->builder).capabilities;
      p_Var48 = (_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)0x0;
      do {
        pTVar8 = pTVar28[(long)p_Var48].type;
        iVar10 = (*type->_vptr_TType[7])(type);
        local_1b0 = p_Var48;
        if (iVar10 == 0x10) {
          pmVar23 = std::__detail::
                    _Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_c0,&local_a8);
          pmVar24 = std::__detail::
                    _Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_b8,pmVar23);
          p_Var48 = (_Map_base<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)(ulong)(uint)(pmVar24->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start[(long)local_1b0];
          bVar9 = filterMember(this,pTVar8);
          if (!bVar9) goto LAB_003bc2a7;
        }
        else {
LAB_003bc2a7:
          iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
          puVar41 = (undefined8 *)CONCAT44(extraout_var_26,iVar10);
          pTVar38 = &memberQualifier;
          for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
            pTVar38->semanticName = (char *)*puVar41;
            puVar41 = puVar41 + (ulong)bVar49 * -2 + 1;
            pTVar38 = (TQualifier *)((long)pTVar38 + (ulong)bVar49 * -0x10 + 8);
          }
          InheritQualifiers(&memberQualifier,local_1c0);
          uVar18 = (uint)p_Var48;
          if (-1 < (int)uVar18) {
            iVar10 = (*pTVar8->_vptr_TType[6])(pTVar8);
            spv::Builder::addMemberName
                      (pBVar1,id,uVar18,*(char **)(CONCAT44(extraout_var_27,iVar10) + 8));
            uVar45 = memberQualifier._8_8_;
            local_1a0 = (_Rb_tree_header *)((ulong)memberQualifier._8_8_ >> 0x3d);
            DVar19 = TranslateLayoutDecoration(pTVar8,memberQualifier._12_4_ >> 0x1d);
            spv::Builder::addMemberDecoration(pBVar1,id,uVar18,DVar19,-1);
            iVar10 = (*pTVar8->_vptr_TType[0xb])(pTVar8);
            DVar19 = DecorationMax;
            if ((*(uint *)(CONCAT44(extraout_var_28,iVar10) + 8) >> 0x19 & 7) - 1 < 2) {
              DVar19 = DecorationRelaxedPrecision;
            }
            spv::Builder::addMemberDecoration(pBVar1,id,uVar18,DVar19,-1);
            iVar10 = (*type->_vptr_TType[0xb])(type);
            if ((((*(uint *)(CONCAT44(extraout_var_29,iVar10) + 8) & 0x7f) == 3) ||
                (iVar10 = (*type->_vptr_TType[0xb])(type),
                (*(uint *)(CONCAT44(extraout_var_30,iVar10) + 8) & 0x7f) == 4)) &&
               ((iVar10 = (*type->_vptr_TType[7])(type), iVar10 == 0x10 ||
                (this->glslangIntermediate->source == EShSourceHlsl)))) {
              _local_190 = uVar45;
              DVar19 = TranslateInterpolationDecoration(this,&memberQualifier);
              spv::Builder::addMemberDecoration(pBVar1,(mapped_type)local_1c8,uVar18,DVar19,-1);
              DVar19 = TranslateAuxiliaryStorageDecoration(this,&memberQualifier);
              spv::Builder::addMemberDecoration(pBVar1,(mapped_type)local_1c8,uVar18,DVar19,-1);
              uVar45 = _local_190;
              id = (mapped_type)local_1c8;
              addMeshNVDecoration(this,(mapped_type)local_1c8,uVar18,&memberQualifier);
            }
            DVar19 = DecorationInvariant;
            if (((uint)uVar45 >> 0x1c & 1) == 0) {
              DVar19 = DecorationMax;
            }
            spv::Builder::addMemberDecoration(pBVar1,id,uVar18,DVar19,-1);
            iVar10 = (*type->_vptr_TType[7])(type);
            p_Var46 = local_1a0;
            if ((iVar10 == 0x10) && ((*(uint *)&local_1c0->field_0x8 & 0x7f) == 6)) {
              _spvMember = (pointer)0x0;
              auStack_160 = (undefined1  [8])0x0;
              local_158._vptr_TType = (_func_int **)0x0;
              TranslateMemoryDecoration
                        (&memberQualifier,
                         (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&spvMember,
                         this->glslangIntermediate->useVulkanMemoryModel);
              if (auStack_160 != (undefined1  [8])_spvMember) {
                uVar44 = 0;
                uVar29 = 1;
                do {
                  spv::Builder::addMemberDecoration
                            (pBVar1,id,uVar18,*(Decoration *)(_spvMember + uVar44 * 4),-1);
                  bVar9 = uVar29 < (ulong)((long)auStack_160 - (long)_spvMember >> 2);
                  uVar44 = uVar29;
                  uVar29 = (ulong)((int)uVar29 + 1);
                } while (bVar9);
              }
              p_Var46 = local_1a0;
              if ((TType *)_spvMember != (TType *)0x0) {
                operator_delete(_spvMember,(long)local_158._vptr_TType - (long)_spvMember);
              }
            }
            if (((char)local_1a4 == '\0') && ((~memberQualifier._28_4_ & 0xfff) != 0)) {
              spv::Builder::addMemberDecoration
                        (pBVar1,id,uVar18,DecorationLocation,memberQualifier._28_4_ & 0xfff);
            }
            iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
            if ((*(uint *)(CONCAT44(extraout_var_31,iVar10) + 0x1c) & 0x7000) != 0x4000) {
              iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
              spv::Builder::addMemberDecoration
                        (pBVar1,id,uVar18,Component,
                         *(uint *)(CONCAT44(extraout_var_32,iVar10) + 0x1c) >> 0xc & 7);
            }
            iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
            if ((~*(uint *)(CONCAT44(extraout_var_33,iVar10) + 0x24) & 0x7ffc0000) == 0) {
              iVar10 = offset;
              if (explicitLayout != ElpNone) {
                iVar10 = (*pTVar8->_vptr_TType[0xb])(pTVar8);
                if (*(int *)(CONCAT44(extraout_var_34,iVar10) + 0x14) != -1) {
                  iVar10 = (*pTVar8->_vptr_TType[0xb])(pTVar8);
                  offset = *(int *)(CONCAT44(extraout_var_35,iVar10) + 0x14);
                }
                if (offset < 0) {
                  offset = 0;
                }
                local_1a8 = glslang::TIntermediate::getMemberAlignment
                                      (pTVar8,(int *)&spvMember,&dummyStride,explicitLayout,
                                       (int)p_Var46 == 1);
                iVar10 = (*pTVar8->_vptr_TType[0x1b])(pTVar8);
                local_190 = (bool)(char)iVar10;
                iVar10 = (*pTVar8->_vptr_TType[0x1c])(pTVar8);
                if ((char)iVar10 != '\0') {
                  iVar10 = (*pTVar8->_vptr_TType[(ulong)((int)p_Var46 == 1) + 0xd])(pTVar8);
                  local_190 = iVar10 == 1;
                }
                iVar10 = local_1a8;
                if ((this->glslangIntermediate->hlslOffsets == true) &&
                   (iVar13 = (*pTVar8->_vptr_TType[0x25])(pTVar8), iVar10 = local_1a8,
                   (char)iVar13 == '\0')) {
                  iVar10 = (*type->_vptr_TType[5])(type);
                  iVar17 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)CONCAT44(extraout_var_44,iVar10),"$Global");
                  iVar13 = local_1a8;
                  iVar10 = local_1a8;
                  if (iVar17 != 0) {
                    iVar17 = glslang::TIntermediate::getBaseAlignmentScalar(pTVar8,&local_1b4);
                    iVar20 = (*pTVar8->_vptr_TType[0x1d])(pTVar8);
                    iVar10 = iVar17;
                    if ((char)iVar20 != '\0') {
                      iVar10 = iVar13;
                    }
                    if (4 < iVar17) {
                      iVar10 = iVar13;
                    }
                    if (local_190 == false) {
                      iVar10 = iVar13;
                    }
                    if (explicitLayout == ElpStd140) {
                      iVar17 = (*pTVar8->_vptr_TType[0x1c])(pTVar8);
                      iVar13 = local_1b4;
                      if ((char)iVar17 == '\0') {
                        iVar17 = (*pTVar8->_vptr_TType[0x1d])(pTVar8);
                        iVar13 = local_1b4;
                        if ((char)iVar17 != '\0') {
                          iVar17 = (*pTVar8->_vptr_TType[0xc])(pTVar8);
                          spvMember = spvMember + (iVar17 + -4) * iVar13;
                        }
                      }
                      else {
                        if ((int)local_1a0 == 1) {
                          iVar17 = (*pTVar8->_vptr_TType[0xd])(pTVar8);
                        }
                        else {
                          iVar17 = (*pTVar8->_vptr_TType[0xe])(pTVar8);
                        }
                        spvMember = spvMember + (iVar17 + -4) * iVar13;
                      }
                    }
                  }
                }
                glslang::RoundToPow2<int>(&offset,iVar10);
                if (explicitLayout != ElpScalar) {
                  bVar9 = glslang::TIntermediate::improperStraddle
                                    (pTVar8,spvMember,offset,local_190);
                  if (bVar9) {
                    offset = offset + 0xfU & 0xfffffff0;
                  }
                }
                iVar10 = spvMember + offset;
                if (-1 < offset) {
                  spv::Builder::addMemberDecoration(pBVar1,id,uVar18,DecorationOffset,offset);
                }
              }
            }
            else {
              iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
              spv::Builder::addMemberDecoration
                        (pBVar1,id,uVar18,DecorationOffset,
                         *(uint *)(CONCAT44(extraout_var_36,iVar10) + 0x24) >> 0x12 & 0x1fff);
              iVar10 = offset;
            }
            offset = iVar10;
            iVar10 = (*pTVar8->_vptr_TType[0x1c])(pTVar8);
            if ((explicitLayout != ElpNone) && ((char)iVar10 != '\0')) {
              uVar44 = memberQualifier._8_8_ & 0xe000000000000000;
              glslang::TType::TType((TType *)&spvMember,EbtVoid,EvqTemporary,1,0,0,false);
              glslang::TType::shallowCopy((TType *)&spvMember,pTVar8);
              local_158.qualifier.spirvDecorate = (TSpirvDecorate *)0x0;
              glslang::TIntermediate::getMemberAlignment
                        ((TType *)&spvMember,&dummyStride,&local_1b4,explicitLayout,
                         uVar44 == 0x2000000000000000);
              spv::Builder::addMemberDecoration(pBVar1,id,uVar18,DecorationMatrixStride,local_1b4);
            }
            iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
            num = TranslateBuiltInDecoration
                            (this,*(uint *)(CONCAT44(extraout_var_37,iVar10) + 8) >> 7 & 0x1ff,true)
            ;
            if (num != BuiltInMax) {
              spv::Builder::addMemberDecoration(pBVar1,(mapped_type)local_1c8,uVar18,BuiltIn,num);
            }
            iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
            DVar19 = TranslateNonUniformDecoration
                               (this,(TQualifier *)CONCAT44(extraout_var_38,iVar10));
            spv::Builder::addMemberDecoration(pBVar1,(mapped_type)local_1c8,uVar18,DVar19,-1);
            pcVar37 = memberQualifier.semanticName;
            if ((memberQualifier.semanticName != (char *)0x0 &
                this->glslangIntermediate->hlslFunctionality1) == 1) {
              spv::Builder::addExtension(pBVar1,"SPV_GOOGLE_hlsl_functionality1");
              spv::Builder::addMemberDecoration
                        (pBVar1,(mapped_type)local_1c8,uVar18,DecorationHlslSemanticGOOGLE,pcVar37);
            }
            id = (mapped_type)local_1c8;
            if (num == BuiltInLayer) {
              iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
              if (*(char *)(CONCAT44(extraout_var_39,iVar10) + 0x30) == '\x01') {
                spv::Builder::addMemberDecoration(pBVar1,id,uVar18,DecorationViewportRelativeNV,-1);
                spvMember = 0x1487;
                std::
                _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                ::_M_insert_unique<spv::Capability_const&>
                          ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                            *)local_158.spirvType,&spvMember);
                spv::Builder::addExtension(pBVar1,"SPV_NV_viewport_array2");
              }
              iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
              if (*(int *)(CONCAT44(extraout_var_40,iVar10) + 0x34) != -0x800) {
                iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
                spv::Builder::addMemberDecoration
                          (pBVar1,id,uVar18,DecorationSecondaryViewportRelativeNV,
                           *(int *)(CONCAT44(extraout_var_41,iVar10) + 0x34));
                spvMember = 0x148b;
                std::
                _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                ::_M_insert_unique<spv::Capability_const&>
                          ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                            *)local_158.spirvType,&spvMember);
                spv::Builder::addExtension(pBVar1,"SPV_NV_stereo_view_rendering");
              }
            }
            iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
            if (*(char *)(CONCAT44(extraout_var_42,iVar10) + 0x2f) == '\x01') {
              spv::Builder::addMemberDecoration(pBVar1,id,uVar18,DecorationPassthroughNV,-1);
              spvMember = 0x1483;
              std::
              _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              ::_M_insert_unique<spv::Capability_const&>
                        ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                          *)local_158.spirvType,&spvMember);
              spv::Builder::addExtension(pBVar1,"SPV_NV_geometry_shader_passthrough");
            }
            iVar10 = (*pTVar8->_vptr_TType[10])(pTVar8);
            if (*(long *)(CONCAT44(extraout_var_43,iVar10) + 0x40) != 0) {
              applySpirvDecorate(this,pTVar8,id,
                                 (optional<int>)(((ulong)p_Var48 & 0xffffffff) + 0x100000000));
            }
          }
        }
        p_Var48 = local_1b0 + 1;
        pTVar28 = (local_a8->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)p_Var48 <
               (long)(int)((ulong)((long)(local_a8->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar28)
                          >> 5));
    }
    DVar19 = TranslateLayoutDecoration
                       (type,(TLayoutMatrix)((ulong)*(undefined8 *)&local_1c0->field_0x8 >> 0x3d));
    spv::Builder::addDecoration(pBVar1,id,DVar19,-1);
    iVar10 = (*type->_vptr_TType[7])(type);
    iVar13 = (*type->_vptr_TType[0xb])(type);
    uVar18 = *(uint *)(CONCAT44(extraout_var_45,iVar13) + 8);
    uVar21 = uVar18 & 0x7f;
    if (iVar10 == 0xf) {
      pTVar33 = this->glslangIntermediate;
      if (((0 < (pTVar33->spvVersion).vulkan) &&
          (spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish)) &&
         ((this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start
          [spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]]->opCode == OpTypeRuntimeArray)) {
        if (0xe < uVar21) goto LAB_003bcde8;
        DVar19 = Block;
        if ((0x7eb8U >> (uVar18 & 0x1f) & 1) == 0) {
          if (uVar21 != 6) goto LAB_003bcde8;
          goto LAB_003bcd00;
        }
        goto LAB_003bcb91;
      }
    }
    else if (iVar10 == 0x10) {
      if (0xe < uVar21) {
LAB_003bcde8:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x188,
                      "spv::Decoration (anonymous namespace)::TranslateBlockDecoration(const glslang::TStorageQualifier, bool)"
                     );
      }
      DVar19 = Block;
      if ((0x7eb8U >> (uVar18 & 0x1f) & 1) == 0) {
        if (uVar21 != 6) goto LAB_003bcde8;
        pTVar33 = this->glslangIntermediate;
LAB_003bcd00:
        DVar19 = pTVar33->useStorageBuffer ^ BufferBlock;
      }
LAB_003bcb91:
      spv::Builder::addDecoration(pBVar1,id,DVar19,-1);
    }
    if (local_1c0->layoutHitObjectShaderRecordNV == true) {
      spv::Builder::addDecoration(pBVar1,id,DecorationHitObjectShaderRecordBufferNV,-1);
    }
    if (0 < (int)((ulong)((long)deferredForwardPointers.
                                super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)deferredForwardPointers.
                               super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x45d1745d) {
      lVar31 = 0;
      lVar47 = 0;
      do {
        puVar41 = (undefined8 *)
                  ((long)&(deferredForwardPointers.
                           super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first + lVar31);
        pIVar39 = &spvMember;
        for (lVar32 = 0xb; lVar32 != 0; lVar32 = lVar32 + -1) {
          *(undefined8 *)pIVar39 = *puVar41;
          puVar41 = puVar41 + (ulong)bVar49 * -2 + 1;
          pIVar39 = pIVar39 + (ulong)bVar49 * -4 + 2;
        }
        convertGlslangToSpvType
                  (this,(TType *)_spvMember,explicitLayout,(TQualifier *)auStack_160,false,false);
        lVar47 = lVar47 + 1;
        lVar31 = lVar31 + 0x58;
      } while (lVar47 < (int)((ulong)((long)deferredForwardPointers.
                                            super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)deferredForwardPointers.
                                           super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x45d1745d);
      id = (mapped_type)local_1c8;
    }
    if (deferredForwardPointers.
        super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(deferredForwardPointers.
                      super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)deferredForwardPointers.
                            super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)deferredForwardPointers.
                            super__Vector_base<std::pair<glslang::TType_*,_glslang::TQualifier>,_std::allocator<std::pair<glslang::TType_*,_glslang::TQualifier>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)spvMembers.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)spvMembers.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    break;
  case 0x11:
    pTVar33 = this->glslangIntermediate;
    if (5 < pTVar33->language - EShLangRayGen) {
      _spvMember = (pointer)&local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&spvMember,"GL_EXT_ray_query","");
      cVar26 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(pTVar33->requestedExtensions)._M_t,(key_type *)&spvMember);
      if ((TType *)_spvMember != &local_158) {
        operator_delete(_spvMember,(ulong)((long)local_158._vptr_TType + 1));
      }
      if ((_Rb_tree_header *)cVar26._M_node !=
          &(pTVar33->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) {
        spv::Builder::addExtension(&this->builder,"SPV_KHR_ray_query");
        spvMember = 0x1178;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&(this->builder).capabilities,&spvMember);
      }
    }
    id = spv::Builder::makeAccelerationStructureType(&this->builder);
    break;
  case 0x12:
    iVar10 = (*type->_vptr_TType[0x15])(type);
    uVar44 = CONCAT44(extraout_var_07,iVar10);
    p_Var46 = &(this->forwardPointers)._M_t._M_impl.super__Rb_tree_header;
    p_Var40 = (this->forwardPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var35 = &p_Var46->_M_header;
    for (; p_Var40 != (_Base_ptr)0x0;
        p_Var40 = (&p_Var40->_M_left)[*(ulong *)(p_Var40 + 1) < uVar44]) {
      if (*(ulong *)(p_Var40 + 1) >= uVar44) {
        p_Var35 = p_Var40;
      }
    }
    p_Var40 = &p_Var46->_M_header;
    if (((_Rb_tree_header *)p_Var35 != p_Var46) &&
       (p_Var40 = p_Var35, uVar44 < *(ulong *)(p_Var35 + 1))) {
      p_Var40 = &p_Var46->_M_header;
    }
    this_00 = &this->forwardPointers;
    if ((_Rb_tree_header *)p_Var40 == p_Var46) {
      IVar11 = spv::Builder::makeForwardPointer(&this->builder,PhysicalStorageBuffer);
      iVar10 = (*type->_vptr_TType[0x15])(type);
      _spvMember = (pointer)CONCAT44(extraout_var_08,iVar10);
      pmVar27 = std::
                map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
                ::operator[](this_00,(key_type *)&spvMember);
      *pmVar27 = IVar11;
    }
    iVar10 = (*type->_vptr_TType[0x15])(type);
    _spvMember = (pointer)CONCAT44(extraout_var_09,iVar10);
    pmVar27 = std::
              map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
              ::operator[](this_00,(key_type *)&spvMember);
    id = *pmVar27;
    if (!forwardReferenceOnly) {
      iVar10 = (*type->_vptr_TType[0x15])(type);
      IVar11 = convertGlslangToSpvType
                         (this,(TType *)CONCAT44(extraout_var_10,iVar10),forwardReferenceOnly_00);
      iVar10 = (*type->_vptr_TType[0x15])(type);
      _spvMember = (pointer)CONCAT44(extraout_var_11,iVar10);
      pmVar27 = std::
                map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
                ::operator[](this_00,(key_type *)&spvMember);
      spv::Builder::makePointerFromForwardPointer
                (&this->builder,PhysicalStorageBuffer,*pmVar27,IVar11);
    }
    break;
  case 0x13:
    pTVar33 = this->glslangIntermediate;
    memberQualifier.semanticName = (char *)0x10;
    _spvMember = (pointer)&local_158;
    _spvMember = (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&spvMember,(ulong)&memberQualifier);
    local_158._vptr_TType = (_func_int **)memberQualifier.semanticName;
    ((TType *)_spvMember)->_vptr_TType = (_func_int **)0x725f5458455f4c47;
    ((TType *)_spvMember)->field_0x8 = 'a';
    ((TType *)_spvMember)->field_0x9 = 'y';
    ((TType *)_spvMember)->field_0xa = '_';
    ((TType *)_spvMember)->field_0xb = 'q';
    ((TType *)_spvMember)->field_0xc = 'u';
    ((TType *)_spvMember)->field_0xd = 'e';
    ((TType *)_spvMember)->field_0xe = 'r';
    ((TType *)_spvMember)->field_0xf = 'y';
    auStack_160 = (undefined1  [8])memberQualifier.semanticName;
    *(char *)((long)&((TType *)_spvMember)->_vptr_TType + (long)memberQualifier.semanticName) = '\0'
    ;
    cVar26 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&(pTVar33->requestedExtensions)._M_t,(key_type *)&spvMember);
    if ((TType *)_spvMember != &local_158) {
      operator_delete(_spvMember,(ulong)((long)local_158._vptr_TType + 1));
    }
    if ((_Rb_tree_header *)cVar26._M_node !=
        &(pTVar33->requestedExtensions)._M_t._M_impl.super__Rb_tree_header) {
      spv::Builder::addExtension(&this->builder,"SPV_KHR_ray_query");
      spvMember = 0x1178;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,&spvMember);
    }
    id = spv::Builder::makeRayQueryType(&this->builder);
    break;
  case 0x14:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_invocation_reorder");
    spvMember = 0x1507;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&spvMember);
    id = spv::Builder::makeHitObjectNVType(&this->builder);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x1442,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                 );
  case 0x17:
    spvMember = 0x153f;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&spvMember);
    spv::Builder::addExtension(&this->builder,"SPV_NV_tensor_addressing");
    _spvMember = (pointer)0x0;
    auStack_160 = (undefined1  [8])0x0;
    local_158._vptr_TType = (_func_int **)0x0;
    iVar10 = 0;
    do {
      iVar13 = (*type->_vptr_TType[0x16])(type);
      IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_05,iVar13) + 8),iVar10,
                               true,false);
      memberQualifier.semanticName = (char *)CONCAT71(memberQualifier.semanticName._1_7_,1);
      memberQualifier.semanticName = (char *)CONCAT44(IVar11,(int)memberQualifier.semanticName);
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
      emplace_back<spv::IdImmediate>
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember,
                 (IdImmediate *)&memberQualifier);
      iVar10 = iVar10 + 1;
    } while (iVar10 == 1);
    opcode = OpTypeTensorLayoutNV;
    goto LAB_003bbac3;
  case 0x18:
    spvMember = 0x153f;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&spvMember);
    spv::Builder::addExtension(&this->builder,"SPV_NV_tensor_addressing");
    iVar10 = (*type->_vptr_TType[0x16])(type);
    iVar13 = 0;
    uVar18 = glslang::TSmallArrayVector::getDimSize
                       (*(TSmallArrayVector **)(CONCAT44(extraout_var_12,iVar10) + 8),0);
    if (4 < uVar18 - 1) {
      __assert_fail("dim >= 1 && dim <= 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1439,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                   );
    }
    _spvMember = (pointer)0x0;
    auStack_160 = (undefined1  [8])0x0;
    local_158._vptr_TType = (_func_int **)0x0;
    do {
      iVar10 = (*type->_vptr_TType[0x16])(type);
      IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_13,iVar10) + 8),iVar13,
                               true,iVar13 == 1);
      memberQualifier.semanticName = (char *)CONCAT71(memberQualifier.semanticName._1_7_,1);
      memberQualifier.semanticName = (char *)CONCAT44(IVar11,(int)memberQualifier.semanticName);
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
      emplace_back<spv::IdImmediate>
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember,
                 (IdImmediate *)&memberQualifier);
      iVar13 = iVar13 + 1;
    } while (uVar18 + 2 != iVar13);
    opcode = OpTypeTensorViewNV;
LAB_003bbac3:
    id = spv::Builder::makeGenericType
                   (&this->builder,opcode,
                    (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember);
    if ((TType *)_spvMember != (TType *)0x0) {
      operator_delete(_spvMember,(long)local_158._vptr_TType - (long)_spvMember);
    }
    break;
  case 0x1a:
    this_01 = type->spirvType;
    if (this_01 == (TSpirvType *)0x0) {
      __assert_fail("spirvType",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0xb43,"const TSpirvType &glslang::TType::getSpirvType() const");
    }
    _spvMember = (pointer)0x0;
    auStack_160 = (undefined1  [8])0x0;
    local_158._vptr_TType = (_func_int **)0x0;
    pTVar36 = (this_01->typeParams).
              super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
              .
              super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pTVar6 = (this_01->typeParams).
             super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             .
             super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar36 != pTVar6) {
      do {
        _Var3 = (pTVar36->value).
                super__Variant_base<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>.
                super__Move_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                .
                super__Copy_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                .
                super__Move_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                .
                super__Copy_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                .
                super__Variant_storage_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                ._M_index;
        node = *(TIntermTyped **)
                &(pTVar36->value).
                 super__Variant_base<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>.
                 super__Move_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                 .
                 super__Copy_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                 .
                 super__Move_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                 .
                 super__Copy_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
        ;
        if (node == (TIntermTyped *)0x0 || _Var3 != '\0') {
          if ((_Var3 != '\x01') || (node == (TIntermTyped *)0x0)) {
            __assert_fail("typeParam.getAsType() != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x141d,
                          "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                         );
          }
          IVar11 = convertGlslangToSpvType
                             (this,*(TType **)
                                    &(pTVar36->value).
                                     super__Variant_base<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                                     .
                                     super__Move_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                                     .
                                     super__Copy_assign_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                                     .
                                     super__Move_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                                     .
                                     super__Copy_ctor_alias<const_glslang::TIntermConstantUnion_*,_const_glslang::TType_*>
                              ,node == (TIntermTyped *)0x0 || _Var3 != '\0');
LAB_003bb30e:
          memberQualifier.semanticName = (char *)CONCAT71(memberQualifier.semanticName._1_7_,1);
LAB_003bb316:
          memberQualifier.semanticName = (char *)CONCAT44(IVar11,(int)memberQualifier.semanticName);
LAB_003bb31d:
          std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
          emplace_back<spv::IdImmediate>
                    ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember,
                     (IdImmediate *)&memberQualifier);
        }
        else {
          if ((char)node[1].super_TIntermNode.loc.string != '\x01') {
            IVar11 = createSpvConstant(this,node);
            goto LAB_003bb30e;
          }
          iVar10 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
          if (iVar10 == 1) {
            memberQualifier.semanticName =
                 (char *)(CONCAT44((float)*(double *)
                                           ((node[1].super_TIntermNode.loc.name)->_M_dataplus)._M_p,
                                   (int)memberQualifier.semanticName) & 0xffffffffffffff00);
            goto LAB_003bb31d;
          }
          iVar10 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
          if ((iVar10 == 8) ||
             (iVar10 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node), iVar10 == 9)) {
            IVar11 = *(Id *)((node[1].super_TIntermNode.loc.name)->_M_dataplus)._M_p;
LAB_003bb370:
            memberQualifier.semanticName._0_4_ =
                 (int)((ulong)memberQualifier.semanticName >> 8) << 8;
            goto LAB_003bb316;
          }
          iVar10 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
          if (iVar10 == 0xc) {
            IVar11 = (uint)(byte)*((node[1].super_TIntermNode.loc.name)->_M_dataplus)._M_p;
            goto LAB_003bb370;
          }
          iVar10 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
          if (iVar10 != 0x1b) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x1418,
                          "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                         );
          }
          pcVar37 = *(char **)(*(long *)((node[1].super_TIntermNode.loc.name)->_M_dataplus)._M_p + 8
                              );
          spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)spvMembers.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          uVar18 = 0;
          __s = &spvMembers;
          do {
            cVar4 = *pcVar37;
            *(char *)&(__s->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                      .super__Vector_impl_data._M_start = cVar4;
            uVar18 = uVar18 + 1;
            if (uVar18 == 4) {
              memberQualifier.semanticName =
                   (char *)(CONCAT44((Id)spvMembers.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                     (int)memberQualifier.semanticName) & 0xffffffffffffff00);
              std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
              emplace_back<spv::IdImmediate>
                        ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember,
                         (IdImmediate *)&memberQualifier);
              uVar18 = 0;
              __s = &spvMembers;
            }
            else {
              __s = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    ((long)&(__s->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
            }
            pcVar37 = pcVar37 + 1;
          } while (cVar4 != '\0');
          if (uVar18 != 0) {
            if (uVar18 < 4) {
              memset(__s,0,(ulong)(4 - uVar18));
            }
            IVar11 = (Id)spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
            goto LAB_003bb370;
          }
        }
        pTVar36 = pTVar36 + 1;
      } while (pTVar36 != pTVar6);
    }
    iVar10 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)this_01,"");
    if (iVar10 != 0) {
      __assert_fail("spirvInst.set == \"\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1422,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                   );
    }
    id = spv::Builder::makeGenericType
                   (&this->builder,(this_01->spirvInst).id,
                    (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&spvMember);
    if ((TType *)_spvMember != (TType *)0x0) {
      operator_delete(_spvMember,(long)local_158._vptr_TType - (long)_spvMember);
    }
    break;
  case 0x1b:
    return 0;
  }
  iVar10 = (*type->_vptr_TType[0x1c])(type);
  if ((char)iVar10 == '\0') {
    iVar10 = (*type->_vptr_TType[0xc])(type);
    if (1 < iVar10) {
      iVar10 = (*type->_vptr_TType[0xc])(type);
      id = spv::Builder::makeVectorType(&this->builder,id,iVar10);
    }
  }
  else {
    iVar10 = (*type->_vptr_TType[0xd])(type);
    iVar13 = (*type->_vptr_TType[0xe])(type);
    id = spv::Builder::makeMatrixType(&this->builder,id,iVar10,iVar13);
  }
  if ((type->field_0xa & 0x20) != 0) {
    spvMember = 0x14ed;
    psVar2 = &(this->builder).capabilities;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)psVar2,&spvMember);
    spv::Builder::addExtension(&this->builder,"SPV_NV_cooperative_matrix");
    iVar10 = (*type->_vptr_TType[7])(type);
    if (iVar10 == 3) {
      spvMember = 9;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar2,&spvMember);
    }
    iVar10 = (*type->_vptr_TType[7])();
    if ((iVar10 == 5) || (iVar10 = (*type->_vptr_TType[7])(), iVar10 == 4)) {
      spvMember = 0x27;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar2,&spvMember);
    }
    iVar10 = (*type->_vptr_TType[0x16])(type);
    IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_14,iVar10) + 8),1,false,
                             false);
    iVar10 = (*type->_vptr_TType[0x16])(type);
    IVar14 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_15,iVar10) + 8),2,false,
                             false);
    iVar10 = (*type->_vptr_TType[0x16])(type);
    IVar15 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_16,iVar10) + 8),3,false,
                             false);
    id = spv::Builder::makeCooperativeMatrixTypeNV(&this->builder,id,IVar11,IVar14,IVar15);
  }
  if ((type->field_0xa & 0x40) != 0) {
    pBVar1 = &this->builder;
    spvMember = 0x1786;
    psVar2 = &(this->builder).capabilities;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)psVar2,&spvMember);
    spv::Builder::addExtension(pBVar1,"SPV_KHR_cooperative_matrix");
    iVar10 = (*type->_vptr_TType[7])(type);
    if (iVar10 == 3) {
      spvMember = 9;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar2,&spvMember);
    }
    local_1c8 = (_Map_base<long_long,_std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)CONCAT44(local_1c8._4_4_,id);
    iVar10 = (*type->_vptr_TType[7])();
    if ((iVar10 == 5) || (iVar10 = (*type->_vptr_TType[7])(), iVar10 == 4)) {
      spvMember = 0x27;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar2,&spvMember);
    }
    iVar10 = (*type->_vptr_TType[0x16])(type);
    IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_17,iVar10) + 8),0,false,
                             false);
    iVar10 = (*type->_vptr_TType[0x16])(type);
    IVar14 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_18,iVar10) + 8),1,false,
                             false);
    iVar10 = (*type->_vptr_TType[0x16])(type);
    IVar15 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_19,iVar10) + 8),2,false,
                             false);
    uVar18 = *(uint *)&type->field_0x8;
    IVar16 = spv::Builder::makeIntegerType(pBVar1,0x20,false);
    IVar16 = spv::Builder::makeIntConstant(pBVar1,IVar16,uVar18 >> 0x17 & 7,false);
    id = spv::Builder::makeCooperativeMatrixTypeKHR
                   (pBVar1,(mapped_type)local_1c8,IVar11,IVar14,IVar15,IVar16);
  }
  if ((type->field_0xb & 8) != 0) {
    spvMember = 0x1512;
    psVar2 = &(this->builder).capabilities;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)psVar2,&spvMember);
    spv::Builder::addExtension(&this->builder,"SPV_NV_cooperative_vector");
    iVar10 = (*type->_vptr_TType[7])(type);
    if (iVar10 == 3) {
      spvMember = 9;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar2,&spvMember);
    }
    iVar10 = (*type->_vptr_TType[7])(type);
    if ((iVar10 == 5) || (iVar10 = (*type->_vptr_TType[7])(type), iVar10 == 4)) {
      spvMember = 0x27;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)psVar2,&spvMember);
    }
    iVar10 = (*type->_vptr_TType[0x16])(type);
    IVar11 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_20,iVar10) + 8),0,false,
                             false);
    id = spv::Builder::makeCooperativeVectorTypeNV(&this->builder,id,IVar11);
  }
  iVar10 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar10 != '\0') {
    iVar10 = (*type->_vptr_TType[0x13])();
    lVar31 = *(long *)(CONCAT44(extraout_var_21,iVar10) + 8);
    if ((lVar31 == 0) || ((int)((ulong)(*(long *)(lVar31 + 0x10) - *(long *)(lVar31 + 8)) >> 4) < 2)
       ) {
      iVar10 = 0;
      if ((explicitLayout != ElpNone) && (iVar13 = (*type->_vptr_TType[7])(type), iVar13 != 0x10)) {
        glslang::TIntermediate::getMemberAlignment
                  (type,(int *)&spvMember,(int *)&memberQualifier,explicitLayout,
                   (uint)((ulong)*(undefined8 *)&local_1c0->field_0x8 >> 0x3d) == 1);
        iVar10 = (int)memberQualifier.semanticName;
      }
    }
    else {
      iVar13 = 0;
      iVar10 = 0;
      if (explicitLayout != ElpNone) {
        iVar17 = (*type->_vptr_TType[7])();
        iVar10 = 0;
        if (iVar17 != 0x10) {
          glslang::TType::TType((TType *)&spvMember,type,0,false);
          while ((pTVar7 = *(TVector<glslang::TArraySize> **)
                            &((local_158.qualifier.spirvDecorate)->decorates).
                             super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                             ._M_t._M_impl.field_0x8, pTVar7 != (TVector<glslang::TArraySize> *)0x0
                 && (1 < (int)((ulong)((long)(pTVar7->
                                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                             ).
                                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar7->
                                            super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                            ).
                                            super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4)))) {
            glslang::TSmallArrayVector::pop_front
                      ((TSmallArrayVector *)local_158.qualifier.spirvDecorate);
          }
          glslang::TIntermediate::getMemberAlignment
                    ((TType *)&spvMember,(int *)&memberQualifier,(int *)&spvMembers,explicitLayout,
                     (uint)((ulong)*(undefined8 *)&local_1c0->field_0x8 >> 0x3d) == 1);
          iVar10 = (Id)spvMembers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        }
      }
      iVar17 = (*type->_vptr_TType[0x13])();
      lVar31 = *(long *)(CONCAT44(extraout_var_22,iVar17) + 8);
      if (lVar31 != 0) {
        iVar13 = (int)((ulong)(*(long *)(lVar31 + 0x10) - *(long *)(lVar31 + 8)) >> 4);
      }
      if (1 < iVar13) {
        iVar13 = iVar13 + 1;
        do {
          iVar17 = (*type->_vptr_TType[0x13])(type);
          IVar11 = makeArraySizeId(this,(TArraySizes *)CONCAT44(extraout_var_23,iVar17),iVar13 + -2,
                                   false,false);
          id = spv::Builder::makeArrayType(&this->builder,id,IVar11,iVar10);
          if (0 < iVar10) {
            spv::Builder::addDecoration(&this->builder,id,ArrayStride,iVar10);
          }
          iVar17 = (*type->_vptr_TType[0x13])(type);
          uVar18 = glslang::TSmallArrayVector::getDimSize
                             ((TSmallArrayVector *)CONCAT44(extraout_var_24,iVar17),iVar13 + -2);
          iVar10 = iVar10 * uVar18;
          iVar13 = iVar13 + -1;
        } while (2 < iVar13);
      }
    }
    iVar13 = (*type->_vptr_TType[0x1e])(type);
    if ((char)iVar13 == '\0') {
      if ((char)local_a0 == '\0') {
        if ((this->builder).spvVersion < 0x10500) {
          spv::Builder::addExtension(&this->builder,"SPV_EXT_descriptor_indexing");
        }
        spvMember = 0x14b6;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&(this->builder).capabilities,&spvMember);
      }
      id = spv::Builder::makeRuntimeArray(&this->builder,id);
    }
    else {
      iVar13 = (*type->_vptr_TType[0x13])(type);
      IVar11 = makeArraySizeId(this,(TArraySizes *)CONCAT44(extraout_var_25,iVar13),0,false,false);
      id = spv::Builder::makeArrayType(&this->builder,id,IVar11,iVar10);
    }
    if (0 < iVar10) {
      spv::Builder::addDecoration(&this->builder,id,ArrayStride,iVar10);
    }
  }
  return id;
}

Assistant:

spv::Id TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType& type,
    glslang::TLayoutPacking explicitLayout, const glslang::TQualifier& qualifier,
    bool lastBufferBlockMember, bool forwardReferenceOnly)
{
    spv::Id spvType = spv::NoResult;

    switch (type.getBasicType()) {
    case glslang::EbtVoid:
        spvType = builder.makeVoidType();
        assert (! type.isArray());
        break;
    case glslang::EbtBool:
        // "transparent" bool doesn't exist in SPIR-V.  The GLSL convention is
        // a 32-bit int where non-0 means true.
        if (explicitLayout != glslang::ElpNone)
            spvType = builder.makeUintType(32);
        else
            spvType = builder.makeBoolType();
        break;
    case glslang::EbtInt:
        spvType = builder.makeIntType(32);
        break;
    case glslang::EbtUint:
        spvType = builder.makeUintType(32);
        break;
    case glslang::EbtFloat:
        spvType = builder.makeFloatType(32);
        break;
    case glslang::EbtDouble:
        spvType = builder.makeFloatType(64);
        break;
    case glslang::EbtFloat16:
        spvType = builder.makeFloatType(16);
        break;
    case glslang::EbtInt8:
        spvType = builder.makeIntType(8);
        break;
    case glslang::EbtUint8:
        spvType = builder.makeUintType(8);
        break;
    case glslang::EbtInt16:
        spvType = builder.makeIntType(16);
        break;
    case glslang::EbtUint16:
        spvType = builder.makeUintType(16);
        break;
    case glslang::EbtInt64:
        spvType = builder.makeIntType(64);
        break;
    case glslang::EbtUint64:
        spvType = builder.makeUintType(64);
        break;
    case glslang::EbtAtomicUint:
        builder.addCapability(spv::CapabilityAtomicStorage);
        spvType = builder.makeUintType(32);
        break;
    case glslang::EbtAccStruct:
        switch (glslangIntermediate->getStage()) {
        case EShLangRayGen:
        case EShLangIntersect:
        case EShLangAnyHit:
        case EShLangClosestHit:
        case EShLangMiss:
        case EShLangCallable:
            // these all should have the RayTracingNV/KHR capability already
            break;
        default:
            {
                auto& extensions = glslangIntermediate->getRequestedExtensions();
                if (extensions.find("GL_EXT_ray_query") != extensions.end()) {
                    builder.addExtension(spv::E_SPV_KHR_ray_query);
                    builder.addCapability(spv::CapabilityRayQueryKHR);
                }
            }
            break;
        }
        spvType = builder.makeAccelerationStructureType();
        break;
    case glslang::EbtRayQuery:
        {
            auto& extensions = glslangIntermediate->getRequestedExtensions();
            if (extensions.find("GL_EXT_ray_query") != extensions.end()) {
                builder.addExtension(spv::E_SPV_KHR_ray_query);
                builder.addCapability(spv::CapabilityRayQueryKHR);
            }
            spvType = builder.makeRayQueryType();
        }
        break;
    case glslang::EbtReference:
        {
            // Make the forward pointer, then recurse to convert the structure type, then
            // patch up the forward pointer with a real pointer type.
            if (forwardPointers.find(type.getReferentType()) == forwardPointers.end()) {
                spv::Id forwardId = builder.makeForwardPointer(spv::StorageClassPhysicalStorageBufferEXT);
                forwardPointers[type.getReferentType()] = forwardId;
            }
            spvType = forwardPointers[type.getReferentType()];
            if (!forwardReferenceOnly) {
                spv::Id referentType = convertGlslangToSpvType(*type.getReferentType());
                builder.makePointerFromForwardPointer(spv::StorageClassPhysicalStorageBufferEXT,
                                                      forwardPointers[type.getReferentType()],
                                                      referentType);
            }
        }
        break;
    case glslang::EbtSampler:
        {
            const glslang::TSampler& sampler = type.getSampler();
            if (sampler.isPureSampler()) {
                spvType = builder.makeSamplerType();
            } else {
                // an image is present, make its type
                spvType = builder.makeImageType(getSampledType(sampler), TranslateDimensionality(sampler),
                                                sampler.isShadow(), sampler.isArrayed(), sampler.isMultiSample(),
                                                sampler.isImageClass() ? 2 : 1, TranslateImageFormat(type));
                if (sampler.isCombined() &&
                    (!sampler.isBuffer() || glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_6)) {
                    // Already has both image and sampler, make the combined type. Only combine sampler to
                    // buffer if before SPIR-V 1.6.
                    spvType = builder.makeSampledImageType(spvType);
                }
            }
        }
        break;
    case glslang::EbtStruct:
    case glslang::EbtBlock:
        {
            // If we've seen this struct type, return it
            const glslang::TTypeList* glslangMembers = type.getStruct();

            // Try to share structs for different layouts, but not yet for other
            // kinds of qualification (primarily not yet including interpolant qualification).
            if (! HasNonLayoutQualifiers(type, qualifier))
                spvType = structMap[explicitLayout][qualifier.layoutMatrix][glslangMembers];
            if (spvType != spv::NoResult)
                break;

            // else, we haven't seen it...
            if (type.getBasicType() == glslang::EbtBlock)
                memberRemapper[glslangTypeToIdMap[glslangMembers]].resize(glslangMembers->size());
            spvType = convertGlslangStructToSpvType(type, glslangMembers, explicitLayout, qualifier);
        }
        break;
    case glslang::EbtString:
        // no type used for OpString
        return 0;

    case glslang::EbtHitObjectNV: {
        builder.addExtension(spv::E_SPV_NV_shader_invocation_reorder);
        builder.addCapability(spv::CapabilityShaderInvocationReorderNV);
        spvType = builder.makeHitObjectNVType();
    }
    break;
    case glslang::EbtSpirvType: {
        // GL_EXT_spirv_intrinsics
        const auto& spirvType = type.getSpirvType();
        const auto& spirvInst = spirvType.spirvInst;

        std::vector<spv::IdImmediate> operands;
        for (const auto& typeParam : spirvType.typeParams) {
            if (typeParam.getAsConstant() != nullptr) {
                // Constant expression
                auto constant = typeParam.getAsConstant();
                if (constant->isLiteral()) {
                    if (constant->getBasicType() == glslang::EbtFloat) {
                        float floatValue = static_cast<float>(constant->getConstArray()[0].getDConst());
                        unsigned literal;
                        static_assert(sizeof(literal) == sizeof(floatValue), "sizeof(unsigned) != sizeof(float)");
                        memcpy(&literal, &floatValue, sizeof(literal));
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtInt) {
                        unsigned literal = constant->getConstArray()[0].getIConst();
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtUint) {
                        unsigned literal = constant->getConstArray()[0].getUConst();
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtBool) {
                        unsigned literal = constant->getConstArray()[0].getBConst();
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtString) {
                        auto str = constant->getConstArray()[0].getSConst()->c_str();
                        unsigned literal = 0;
                        char* literalPtr = reinterpret_cast<char*>(&literal);
                        unsigned charCount = 0;
                        char ch = 0;
                        do {
                            ch = *(str++);
                            *(literalPtr++) = ch;
                            ++charCount;
                            if (charCount == 4) {
                                operands.push_back({false, literal});
                                literalPtr = reinterpret_cast<char*>(&literal);
                                charCount = 0;
                            }
                        } while (ch != 0);

                        // Partial literal is padded with 0
                        if (charCount > 0) {
                            for (; charCount < 4; ++charCount)
                                *(literalPtr++) = 0;
                            operands.push_back({false, literal});
                        }
                    } else
                        assert(0); // Unexpected type
                } else
                    operands.push_back({true, createSpvConstant(*constant)});
            } else {
                // Type specifier
                assert(typeParam.getAsType() != nullptr);
                operands.push_back({true, convertGlslangToSpvType(*typeParam.getAsType())});
            }
        }

        assert(spirvInst.set == ""); // Currently, couldn't be extended instructions.
        spvType = builder.makeGenericType(static_cast<spv::Op>(spirvInst.id), operands);

        break;
    }
    case glslang::EbtTensorLayoutNV:
    {
        builder.addCapability(spv::CapabilityTensorAddressingNV);
        builder.addExtension(spv::E_SPV_NV_tensor_addressing);

        std::vector<spv::IdImmediate> operands;
        for (uint32_t i = 0; i < 2; ++i) {
            operands.push_back({true, makeArraySizeId(*type.getTypeParameters()->arraySizes, i, true)});
        }
        spvType = builder.makeGenericType(spv::OpTypeTensorLayoutNV, operands);
        break;
    }
    case glslang::EbtTensorViewNV:
    {
        builder.addCapability(spv::CapabilityTensorAddressingNV);
        builder.addExtension(spv::E_SPV_NV_tensor_addressing);

        uint32_t dim = type.getTypeParameters()->arraySizes->getDimSize(0);
        assert(dim >= 1 && dim <= 5);
        std::vector<spv::IdImmediate> operands;
        for (uint32_t i = 0; i < dim + 2; ++i) {
            operands.push_back({true, makeArraySizeId(*type.getTypeParameters()->arraySizes, i, true, i==1)});
        }
        spvType = builder.makeGenericType(spv::OpTypeTensorViewNV, operands);
        break;
    }
    default:
        assert(0);
        break;
    }

    if (type.isMatrix())
        spvType = builder.makeMatrixType(spvType, type.getMatrixCols(), type.getMatrixRows());
    else {
        // If this variable has a vector element count greater than 1, create a SPIR-V vector
        if (type.getVectorSize() > 1)
            spvType = builder.makeVectorType(spvType, type.getVectorSize());
    }

    if (type.isCoopMatNV()) {
        builder.addCapability(spv::CapabilityCooperativeMatrixNV);
        builder.addExtension(spv::E_SPV_NV_cooperative_matrix);

        if (type.getBasicType() == glslang::EbtFloat16)
            builder.addCapability(spv::CapabilityFloat16);
        if (type.getBasicType() == glslang::EbtUint8 ||
            type.getBasicType() == glslang::EbtInt8) {
            builder.addCapability(spv::CapabilityInt8);
        }

        spv::Id scope = makeArraySizeId(*type.getTypeParameters()->arraySizes, 1);
        spv::Id rows = makeArraySizeId(*type.getTypeParameters()->arraySizes, 2);
        spv::Id cols = makeArraySizeId(*type.getTypeParameters()->arraySizes, 3);

        spvType = builder.makeCooperativeMatrixTypeNV(spvType, scope, rows, cols);
    }

    if (type.isCoopMatKHR()) {
        builder.addCapability(spv::CapabilityCooperativeMatrixKHR);
        builder.addExtension(spv::E_SPV_KHR_cooperative_matrix);

        if (type.getBasicType() == glslang::EbtFloat16)
            builder.addCapability(spv::CapabilityFloat16);
        if (type.getBasicType() == glslang::EbtUint8 || type.getBasicType() == glslang::EbtInt8) {
            builder.addCapability(spv::CapabilityInt8);
        }

        spv::Id scope = makeArraySizeId(*type.getTypeParameters()->arraySizes, 0);
        spv::Id rows = makeArraySizeId(*type.getTypeParameters()->arraySizes, 1);
        spv::Id cols = makeArraySizeId(*type.getTypeParameters()->arraySizes, 2);
        spv::Id use = builder.makeUintConstant(type.getCoopMatKHRuse());

        spvType = builder.makeCooperativeMatrixTypeKHR(spvType, scope, rows, cols, use);
    }

    if (type.isCoopVecNV()) {
        builder.addCapability(spv::CapabilityCooperativeVectorNV);
        builder.addExtension(spv::E_SPV_NV_cooperative_vector);

        if (type.getBasicType() == glslang::EbtFloat16)
            builder.addCapability(spv::CapabilityFloat16);
        if (type.getBasicType() == glslang::EbtUint8 || type.getBasicType() == glslang::EbtInt8) {
            builder.addCapability(spv::CapabilityInt8);
        }

        spv::Id components = makeArraySizeId(*type.getTypeParameters()->arraySizes, 0);

        spvType = builder.makeCooperativeVectorTypeNV(spvType, components);
    }

    if (type.isArray()) {
        int stride = 0;  // keep this 0 unless doing an explicit layout; 0 will mean no decoration, no stride

        // Do all but the outer dimension
        if (type.getArraySizes()->getNumDims() > 1) {
            // We need to decorate array strides for types needing explicit layout, except blocks.
            if (explicitLayout != glslang::ElpNone && type.getBasicType() != glslang::EbtBlock) {
                // Use a dummy glslang type for querying internal strides of
                // arrays of arrays, but using just a one-dimensional array.
                glslang::TType simpleArrayType(type, 0); // deference type of the array
                while (simpleArrayType.getArraySizes()->getNumDims() > 1)
                    simpleArrayType.getArraySizes()->dereference();

                // Will compute the higher-order strides here, rather than making a whole
                // pile of types and doing repetitive recursion on their contents.
                stride = getArrayStride(simpleArrayType, explicitLayout, qualifier.layoutMatrix);
            }

            // make the arrays
            for (int dim = type.getArraySizes()->getNumDims() - 1; dim > 0; --dim) {
                spvType = builder.makeArrayType(spvType, makeArraySizeId(*type.getArraySizes(), dim), stride);
                if (stride > 0)
                    builder.addDecoration(spvType, spv::DecorationArrayStride, stride);
                stride *= type.getArraySizes()->getDimSize(dim);
            }
        } else {
            // single-dimensional array, and don't yet have stride

            // We need to decorate array strides for types needing explicit layout, except blocks.
            if (explicitLayout != glslang::ElpNone && type.getBasicType() != glslang::EbtBlock)
                stride = getArrayStride(type, explicitLayout, qualifier.layoutMatrix);
        }

        // Do the outer dimension, which might not be known for a runtime-sized array.
        // (Unsized arrays that survive through linking will be runtime-sized arrays)
        if (type.isSizedArray())
            spvType = builder.makeArrayType(spvType, makeArraySizeId(*type.getArraySizes(), 0), stride);
        else {
            if (!lastBufferBlockMember) {
                builder.addIncorporatedExtension("SPV_EXT_descriptor_indexing", spv::Spv_1_5);
                builder.addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
            }
            spvType = builder.makeRuntimeArray(spvType);
        }
        if (stride > 0)
            builder.addDecoration(spvType, spv::DecorationArrayStride, stride);
    }

    return spvType;
}